

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O1

char * CB::bufread_label(label *ld,char *c,io_buf *cache)

{
  size_t sVar1;
  long lVar2;
  cb_class temp;
  char *local_40;
  cb_class local_38;
  
  lVar2 = *(long *)c;
  local_40 = c;
  v_array<CB::cb_class>::clear(&ld->costs);
  local_40 = local_40 + 8;
  sVar1 = io_buf::buf_read(cache,&local_40,lVar2 << 4);
  if (sVar1 < (ulong)(lVar2 << 4)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"error in demarshal of cost data",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  else if (lVar2 != 0) {
    do {
      local_38._0_8_ = *(undefined8 *)local_40;
      local_38._8_8_ = *(undefined8 *)(local_40 + 8);
      local_40 = local_40 + 0x10;
      v_array<CB::cb_class>::push_back(&ld->costs,&local_38);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return local_40;
}

Assistant:

char* bufread_label(CB::label* ld, char* c, io_buf& cache)
{
  size_t num = *(size_t*)c;
  ld->costs.clear();
  c += sizeof(size_t);
  size_t total = sizeof(cb_class) * num;
  if (cache.buf_read(c, total) < total)
  {
    cout << "error in demarshal of cost data" << endl;
    return c;
  }
  for (size_t i = 0; i < num; i++)
  {
    cb_class temp = *(cb_class*)c;
    c += sizeof(cb_class);
    ld->costs.push_back(temp);
  }

  return c;
}